

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeMatrB
          (ChElementHexaCorot_8 *this,ChMatrixDynamic<> *MatrB,double zeta1,double zeta2,
          double zeta3,double *JacobianDet)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ActualDstType actualDst;
  Scalar SVar4;
  ChMatrixDynamic<> Jacobian;
  ChMatrixDynamic<> J1;
  ChMatrixDynamic<> Btemp;
  ChMatrixDynamic<> Jinv;
  assign_op<double,_double> local_d9;
  DenseStorage<double,__1,__1,__1,_1> local_d8;
  DenseStorage<double,__1,__1,__1,_1> local_b8;
  double local_98;
  double local_90;
  double local_88;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_80;
  double *local_68;
  ulong local_60;
  ulong local_58;
  long local_50 [2];
  long local_40;
  double local_38;
  double local_30;
  double local_28;
  
  local_d8.m_data = (double *)0x0;
  local_d8.m_rows = 0;
  local_d8.m_cols = 0;
  local_98 = zeta1;
  local_90 = zeta2;
  local_88 = zeta3;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_d8,9,3,3);
  local_b8.m_data = (double *)0x0;
  local_b8.m_rows = 0;
  local_b8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_b8,0x18,3,8);
  local_38 = local_98;
  local_30 = local_90;
  local_28 = local_88;
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xc])(this,&local_d8,&local_b8);
  SVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_d8);
  *JacobianDet = SVar4;
  if (local_d8.m_rows != local_d8.m_cols) {
    __assert_fail("rows() == cols()","/usr/include/eigen3/Eigen/src/LU/InverseImpl.h",0x15f,
                  "const Inverse<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1, 1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  local_80.m_rows.m_value = (long)&local_d8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Inverse<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_50,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)&local_80);
  if (local_40 == local_b8.m_rows) {
    local_80.m_rows.m_value = (long)local_50;
    local_80.m_cols.m_value = (long)&local_b8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_68,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                *)&local_80);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)MatrB,0x90,6,0x18);
    local_80.m_rows.m_value =
         (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
    local_80.m_cols.m_value =
         (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
    local_80.m_functor.m_other = 0.0;
    if ((local_80.m_cols.m_value | local_80.m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (MatrB,&local_80,&local_d9);
    if ((((0 < (long)local_60) && (0 < (long)local_58)) &&
        (uVar1 = (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                 .m_rows, 0 < (long)uVar1)) &&
       (uVar2 = (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_cols, 0 < (long)uVar2)) {
      pdVar3 = (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_data;
      *pdVar3 = *local_68;
      if (((((local_58 != 1) && (3 < uVar2)) &&
           ((pdVar3[3] = local_68[1], 2 < local_58 &&
            ((6 < uVar2 && (pdVar3[6] = local_68[2], local_58 != 3)))))) &&
          ((9 < uVar2 &&
           ((((pdVar3[9] = local_68[3], 4 < local_58 && (0xc < uVar2)) &&
             (pdVar3[0xc] = local_68[4], local_58 != 5)) &&
            ((0xf < uVar2 && (pdVar3[0xf] = local_68[5], 6 < local_58)))))))) &&
         ((((0x12 < uVar2 && ((pdVar3[0x12] = local_68[6], local_58 != 7 && (0x15 < uVar2)))) &&
           (pdVar3[0x15] = local_68[7], local_60 != 1)) && (uVar1 != 1)))) {
        pdVar3[uVar2 + 1] = local_68[local_58];
        pdVar3[uVar2 + 4] = local_68[local_58 + 1];
        pdVar3[uVar2 + 7] = local_68[local_58 + 2];
        pdVar3[uVar2 + 10] = local_68[local_58 + 3];
        pdVar3[uVar2 + 0xd] = local_68[local_58 + 4];
        pdVar3[uVar2 + 0x10] = local_68[local_58 + 5];
        pdVar3[uVar2 + 0x13] = local_68[local_58 + 6];
        if (((uVar2 != 0x16) && (pdVar3[uVar2 + 0x16] = local_68[local_58 + 7], 2 < local_60)) &&
           (2 < uVar1)) {
          pdVar3[uVar2 * 2 + 2] = local_68[local_58 * 2];
          pdVar3[uVar2 * 2 + 5] = local_68[local_58 * 2 + 1];
          pdVar3[uVar2 * 2 + 8] = local_68[local_58 * 2 + 2];
          pdVar3[uVar2 * 2 + 0xb] = local_68[local_58 * 2 + 3];
          pdVar3[uVar2 * 2 + 0xe] = local_68[local_58 * 2 + 4];
          pdVar3[uVar2 * 2 + 0x11] = local_68[local_58 * 2 + 5];
          pdVar3[uVar2 * 2 + 0x14] = local_68[local_58 * 2 + 6];
          if ((0x17 < uVar2) && (pdVar3[uVar2 * 2 + 0x17] = local_68[local_58 * 2 + 7], uVar1 != 3))
          {
            pdVar3[uVar2 * 3] = local_68[local_58];
            pdVar3[uVar2 * 3 + 1] = *local_68;
            pdVar3[uVar2 * 3 + 3] = local_68[local_58 + 1];
            pdVar3[uVar2 * 3 + 4] = local_68[1];
            pdVar3[uVar2 * 3 + 6] = local_68[local_58 + 2];
            pdVar3[uVar2 * 3 + 7] = local_68[2];
            pdVar3[uVar2 * 3 + 9] = local_68[local_58 + 3];
            pdVar3[uVar2 * 3 + 10] = local_68[3];
            pdVar3[uVar2 * 3 + 0xc] = local_68[local_58 + 4];
            pdVar3[uVar2 * 3 + 0xd] = local_68[4];
            pdVar3[uVar2 * 3 + 0xf] = local_68[local_58 + 5];
            pdVar3[uVar2 * 3 + 0x10] = local_68[5];
            pdVar3[uVar2 * 3 + 0x12] = local_68[local_58 + 6];
            pdVar3[uVar2 * 3 + 0x13] = local_68[6];
            pdVar3[uVar2 * 3 + 0x15] = local_68[local_58 + 7];
            pdVar3[uVar2 * 3 + 0x16] = local_68[7];
            if (4 < uVar1) {
              pdVar3[uVar2 * 4 + 1] = local_68[local_58 * 2];
              pdVar3[uVar2 * 4 + 2] = local_68[local_58];
              pdVar3[uVar2 * 4 + 4] = local_68[local_58 * 2 + 1];
              pdVar3[uVar2 * 4 + 5] = local_68[local_58 + 1];
              pdVar3[uVar2 * 4 + 7] = local_68[local_58 * 2 + 2];
              pdVar3[uVar2 * 4 + 8] = local_68[local_58 + 2];
              pdVar3[uVar2 * 4 + 10] = local_68[local_58 * 2 + 3];
              pdVar3[uVar2 * 4 + 0xb] = local_68[local_58 + 3];
              pdVar3[uVar2 * 4 + 0xd] = local_68[local_58 * 2 + 4];
              pdVar3[uVar2 * 4 + 0xe] = local_68[local_58 + 4];
              pdVar3[uVar2 * 4 + 0x10] = local_68[local_58 * 2 + 5];
              pdVar3[uVar2 * 4 + 0x11] = local_68[local_58 + 5];
              pdVar3[uVar2 * 4 + 0x13] = local_68[local_58 * 2 + 6];
              pdVar3[uVar2 * 4 + 0x14] = local_68[local_58 + 6];
              pdVar3[uVar2 * 4 + 0x16] = local_68[local_58 * 2 + 7];
              pdVar3[uVar2 * 4 + 0x17] = local_68[local_58 + 7];
              if (uVar1 != 5) {
                pdVar3[uVar2 * 5] = local_68[local_58 * 2];
                pdVar3[uVar2 * 5 + 2] = *local_68;
                pdVar3[uVar2 * 5 + 3] = local_68[local_58 * 2 + 1];
                pdVar3[uVar2 * 5 + 5] = local_68[1];
                pdVar3[uVar2 * 5 + 6] = local_68[local_58 * 2 + 2];
                pdVar3[uVar2 * 5 + 8] = local_68[2];
                pdVar3[uVar2 * 5 + 9] = local_68[local_58 * 2 + 3];
                pdVar3[uVar2 * 5 + 0xb] = local_68[3];
                pdVar3[uVar2 * 5 + 0xc] = local_68[local_58 * 2 + 4];
                pdVar3[uVar2 * 5 + 0xe] = local_68[4];
                pdVar3[uVar2 * 5 + 0xf] = local_68[local_58 * 2 + 5];
                pdVar3[uVar2 * 5 + 0x11] = local_68[5];
                pdVar3[uVar2 * 5 + 0x12] = local_68[local_58 * 2 + 6];
                pdVar3[uVar2 * 5 + 0x14] = local_68[6];
                pdVar3[uVar2 * 5 + 0x15] = local_68[local_58 * 2 + 7];
                pdVar3[uVar2 * 5 + 0x17] = local_68[7];
                free((void *)local_68[-1]);
                if (local_50[0] != 0) {
                  free(*(void **)(local_50[0] + -8));
                }
                if (local_b8.m_data != (double *)0x0) {
                  free((void *)local_b8.m_data[-1]);
                }
                if (local_d8.m_data != (double *)0x0) {
                  free((void *)local_d8.m_data[-1]);
                }
                return;
              }
            }
          }
        }
      }
    }
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementHexaCorot_8::ComputeMatrB(ChMatrixDynamic<>& MatrB,
                                        double zeta1,
                                        double zeta2,
                                        double zeta3,
                                        double& JacobianDet) {
    ChMatrixDynamic<> Jacobian(3, 3);
    ChMatrixDynamic<> J1(3, 8);
    ComputeJacobian(Jacobian, J1, ChVector<>(zeta1, zeta2, zeta3));

    // !!! store the Jacobian Determinant: needed for the integration
    JacobianDet = Jacobian.determinant();

    ChMatrixDynamic<> Jinv = Jacobian.inverse();

    ChMatrixDynamic<> Btemp = Jinv * J1;

    MatrB.setZero(6, 24);  // Remember to resize the matrix!

    MatrB(0, 0) = Btemp(0, 0);
    MatrB(0, 3) = Btemp(0, 1);
    MatrB(0, 6) = Btemp(0, 2);
    MatrB(0, 9) = Btemp(0, 3);
    MatrB(0, 12) = Btemp(0, 4);
    MatrB(0, 15) = Btemp(0, 5);
    MatrB(0, 18) = Btemp(0, 6);
    MatrB(0, 21) = Btemp(0, 7);

    MatrB(1, 1) = Btemp(1, 0);
    MatrB(1, 4) = Btemp(1, 1);
    MatrB(1, 7) = Btemp(1, 2);
    MatrB(1, 10) = Btemp(1, 3);
    MatrB(1, 13) = Btemp(1, 4);
    MatrB(1, 16) = Btemp(1, 5);
    MatrB(1, 19) = Btemp(1, 6);
    MatrB(1, 22) = Btemp(1, 7);

    MatrB(2, 2) = Btemp(2, 0);
    MatrB(2, 5) = Btemp(2, 1);
    MatrB(2, 8) = Btemp(2, 2);
    MatrB(2, 11) = Btemp(2, 3);
    MatrB(2, 14) = Btemp(2, 4);
    MatrB(2, 17) = Btemp(2, 5);
    MatrB(2, 20) = Btemp(2, 6);
    MatrB(2, 23) = Btemp(2, 7);

    MatrB(3, 0) = Btemp(1, 0);
    MatrB(3, 1) = Btemp(0, 0);
    MatrB(3, 3) = Btemp(1, 1);
    MatrB(3, 4) = Btemp(0, 1);
    MatrB(3, 6) = Btemp(1, 2);
    MatrB(3, 7) = Btemp(0, 2);
    MatrB(3, 9) = Btemp(1, 3);
    MatrB(3, 10) = Btemp(0, 3);
    MatrB(3, 12) = Btemp(1, 4);
    MatrB(3, 13) = Btemp(0, 4);
    MatrB(3, 15) = Btemp(1, 5);
    MatrB(3, 16) = Btemp(0, 5);
    MatrB(3, 18) = Btemp(1, 6);
    MatrB(3, 19) = Btemp(0, 6);
    MatrB(3, 21) = Btemp(1, 7);
    MatrB(3, 22) = Btemp(0, 7);

    MatrB(4, 1) = Btemp(2, 0);
    MatrB(4, 2) = Btemp(1, 0);
    MatrB(4, 4) = Btemp(2, 1);
    MatrB(4, 5) = Btemp(1, 1);
    MatrB(4, 7) = Btemp(2, 2);
    MatrB(4, 8) = Btemp(1, 2);
    MatrB(4, 10) = Btemp(2, 3);
    MatrB(4, 11) = Btemp(1, 3);
    MatrB(4, 13) = Btemp(2, 4);
    MatrB(4, 14) = Btemp(1, 4);
    MatrB(4, 16) = Btemp(2, 5);
    MatrB(4, 17) = Btemp(1, 5);
    MatrB(4, 19) = Btemp(2, 6);
    MatrB(4, 20) = Btemp(1, 6);
    MatrB(4, 22) = Btemp(2, 7);
    MatrB(4, 23) = Btemp(1, 7);

    MatrB(5, 0) = Btemp(2, 0);
    MatrB(5, 2) = Btemp(0, 0);
    MatrB(5, 3) = Btemp(2, 1);
    MatrB(5, 5) = Btemp(0, 1);
    MatrB(5, 6) = Btemp(2, 2);
    MatrB(5, 8) = Btemp(0, 2);
    MatrB(5, 9) = Btemp(2, 3);
    MatrB(5, 11) = Btemp(0, 3);
    MatrB(5, 12) = Btemp(2, 4);
    MatrB(5, 14) = Btemp(0, 4);
    MatrB(5, 15) = Btemp(2, 5);
    MatrB(5, 17) = Btemp(0, 5);
    MatrB(5, 18) = Btemp(2, 6);
    MatrB(5, 20) = Btemp(0, 6);
    MatrB(5, 21) = Btemp(2, 7);
    MatrB(5, 23) = Btemp(0, 7);
}